

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

bool helics::core::isCoreTypeAvailable(CoreType type)

{
  switch(type) {
  case DEFAULT:
  case ZMQ:
  case INTERPROCESS:
  case IPC:
  case TCP:
  case UDP:
  case ZMQ_SS:
  case TCP_SS:
  case INPROC:
    goto switchD_002aa91d_caseD_2;
  case MPI:
  case TEST:
  case 8:
  case NNG:
  case HTTP:
  case HTTP|ZMQ:
  case WEBSOCKET:
  case WEBSOCKET|ZMQ:
  case 0x10:
  case 0x11:
    return false;
  default:
    if (type != EMPTY) {
      return false;
    }
switchD_002aa91d_caseD_2:
    return true;
  }
}

Assistant:

bool isCoreTypeAvailable(CoreType type) noexcept
{
    bool available{false};

    switch (type) {
        case CoreType::ZMQ:
        case CoreType::ZMQ_SS:
            available = zmq_availability;
            break;
        case CoreType::MPI:
            available = mpi_availability;
            break;
        case CoreType::TEST:
            available = test_availability;
            break;
        case CoreType::INTERPROCESS:
        case CoreType::IPC:
            available = ipc_availability;
            break;
        case CoreType::UDP:
            available = udp_availability;
            break;
        case CoreType::TCP:
        case CoreType::TCP_SS:
            available = tcp_availability;
            break;
        case CoreType::DEFAULT:  // default and empty should always be available
        case CoreType::EMPTY:
            available = true;
            break;
        case CoreType::INPROC:
            available = inproc_availability;
            break;
        case CoreType::HTTP:
        case CoreType::WEBSOCKET:
            return false;  // these are not yet built
            break;
        case CoreType::NULLCORE:
            available = false;  // nullcore is never available
            break;
        default:
            break;
    }

    return available;
}